

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O0

void show_mem(RK_U32 *buf,RK_S32 size)

{
  uint local_14;
  RK_U32 *pRStack_10;
  RK_S32 size_local;
  RK_U32 *buf_local;
  
  _mpp_log_l(2,"mpp_mem","dumping buf %p size %d start\n",(char *)0x0,buf,(ulong)(uint)size);
  local_14 = size;
  pRStack_10 = buf;
LAB_00122045:
  do {
    if ((int)local_14 < 1) {
LAB_001221c1:
      _mpp_log_l(2,"mpp_mem","dumping buf %p size %d end\n",(char *)0x0,pRStack_10,(ulong)local_14);
      return;
    }
    if (0xf < (int)local_14) {
      _mpp_log_l(2,"mpp_mem","%08x %08x %08x %08x\n",(char *)0x0,(ulong)*pRStack_10,
                 (ulong)pRStack_10[1],pRStack_10[2],pRStack_10[3]);
      pRStack_10 = pRStack_10 + 4;
      local_14 = local_14 - 0x10;
      goto LAB_00122045;
    }
    if ((int)local_14 < 0xc) {
      if ((int)local_14 < 8) {
        if ((int)local_14 < 4) {
          _mpp_log_l(4,"mpp_mem","end with size %d\n",(char *)0x0,(ulong)local_14);
          goto LAB_001221c1;
        }
        _mpp_log_l(2,"mpp_mem","%08x\n",(char *)0x0,(ulong)*pRStack_10);
        pRStack_10 = pRStack_10 + 1;
        local_14 = local_14 - 4;
      }
      else {
        _mpp_log_l(2,"mpp_mem","%08x %08x\n",(char *)0x0,(ulong)*pRStack_10,(ulong)pRStack_10[1]);
        pRStack_10 = pRStack_10 + 2;
        local_14 = local_14 - 8;
      }
    }
    else {
      _mpp_log_l(2,"mpp_mem","%08x %08x %08x\n",(char *)0x0,(ulong)*pRStack_10,(ulong)pRStack_10[1],
                 pRStack_10[2]);
      pRStack_10 = pRStack_10 + 3;
      local_14 = local_14 - 0xc;
    }
  } while( true );
}

Assistant:

static void show_mem(RK_U32 *buf, RK_S32 size)
{
    mpp_err("dumping buf %p size %d start\n", buf, size);
    while (size > 0) {
        if (size >= 16) {
            mpp_err("%08x %08x %08x %08x\n", buf[0], buf[1], buf[2], buf[3]);
            buf += 4;
            size -= 16;
        } else if (size >= 12) {
            mpp_err("%08x %08x %08x\n", buf[0], buf[1], buf[2]);
            buf += 3;
            size -= 12;
        } else if (size >= 8) {
            mpp_err("%08x %08x\n", buf[0], buf[1]);
            buf += 2;
            size -= 8;
        } else if (size >= 4) {
            mpp_err("%08x\n", buf[0]);
            buf += 1;
            size -= 4;
        } else {
            mpp_log("end with size %d\n", size);
            break;
        }
    }
    mpp_err("dumping buf %p size %d end\n", buf, size);
}